

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O3

void __thiscall HFactor::updateFT(HFactor *this,HVector *aq,HVector *ep,int iRow,int *hint)

{
  vector<int,_std::allocator<int>_> *this_00;
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pdVar4;
  iterator iVar5;
  iterator iVar6;
  int iVar7;
  HVector *pHVar8;
  int iVar9;
  pointer piVar10;
  pointer piVar11;
  double *__args;
  size_t sVar12;
  int iVar13;
  long lVar14;
  pointer piVar15;
  int *piVar16;
  long lVar17;
  int iVar18;
  size_type __new_size;
  long lVar19;
  double dVar20;
  int local_94;
  double local_90;
  double local_88;
  long local_80;
  vector<int,std::allocator<int>> *local_78;
  int local_6c;
  HVector *local_68;
  vector<double,_std::allocator<double>_> *local_60;
  vector<int,_std::allocator<int>_> *local_58;
  vector<int,std::allocator<int>> *local_50;
  double local_48;
  long local_40;
  long local_38;
  
  piVar10 = (this->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_80 = (long)piVar10[iRow];
  local_48 = (this->UpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[local_80];
  local_88 = (aq->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iRow];
  (this->UpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[local_80] = -1;
  piVar11 = (this->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar1 = (this->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_78 = (vector<int,std::allocator<int>> *)
             (this->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  iVar18 = (*(int *)(local_78 + local_80 * 4) - piVar11[local_80]) + this->FtotalX;
  this->FtotalX = iVar18;
  lVar17 = (long)*(int *)(local_78 + local_80 * 4);
  if (*(int *)(local_78 + local_80 * 4) < piVar11[local_80]) {
    piVar2 = (this->URindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar15 = (this->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar3 = (this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      iVar18 = piVar10[piVar2[lVar17]];
      iVar13 = piVar1[iVar18];
      iVar9 = piVar15[iVar18];
      piVar15[iVar18] = iVar9 + -1;
      iVar18 = iVar13;
      if (iVar13 < iVar9) {
        piVar16 = piVar3 + iVar13;
        do {
          iVar18 = iVar13;
          if (*piVar16 == iRow) break;
          iVar13 = iVar13 + 1;
          piVar16 = piVar16 + 1;
          iVar18 = iVar9;
        } while (iVar9 != iVar13);
      }
      piVar3[iVar18] = piVar3[(long)iVar9 + -1];
      pdVar4[iVar18] = pdVar4[(long)iVar9 + -1];
      lVar17 = lVar17 + 1;
    } while (lVar17 < piVar11[local_80]);
    iVar18 = this->FtotalX;
  }
  else {
    piVar15 = (this->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  this->FtotalX = (piVar1[local_80] - piVar15[local_80]) + iVar18;
  lVar17 = (long)piVar1[local_80];
  piVar2 = (this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1[local_80] < piVar15[local_80]) {
    piVar1 = (this->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->URindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->URvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      lVar14 = (long)piVar10[piVar2[lVar17]];
      iVar18 = *(int *)(local_78 + lVar14 * 4);
      iVar13 = piVar11[lVar14];
      piVar11[lVar14] = iVar13 + -1;
      iVar9 = iVar18;
      if (iVar18 < iVar13) {
        piVar16 = piVar3 + iVar18;
        do {
          iVar9 = iVar18;
          if (*piVar16 == iRow) break;
          iVar18 = iVar18 + 1;
          piVar16 = piVar16 + 1;
          iVar9 = iVar13;
        } while (iVar13 != iVar18);
      }
      piVar16 = piVar1 + lVar14;
      *piVar16 = *piVar16 + 1;
      piVar3[iVar9] = piVar3[(long)iVar13 + -1];
      pdVar4[iVar9] = pdVar4[(long)iVar13 + -1];
      lVar17 = lVar17 + 1;
    } while (lVar17 < piVar15[local_80]);
  }
  iVar18 = (int)((ulong)((long)(this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar2) >> 2);
  local_90 = (double)CONCAT44(local_90._4_4_,iVar18);
  iVar5._M_current =
       (this->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_94 = iRow;
  local_68 = ep;
  if (iVar5._M_current ==
      (this->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->Ustart,iVar5,(int *)&local_90);
  }
  else {
    *iVar5._M_current = iVar18;
    (this->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar5._M_current + 1;
  }
  dVar20 = local_88;
  if (0 < aq->packCount) {
    local_78 = (vector<int,std::allocator<int>> *)&this->Uindex;
    lVar17 = 0;
    lVar19 = 0;
    lVar14 = 0;
    do {
      piVar10 = (aq->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar18 = *(int *)((long)piVar10 + lVar19);
      if (iVar18 != iRow) {
        iVar5._M_current =
             (this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_78,iVar5,(int *)((long)piVar10 + lVar19));
          dVar20 = local_88;
        }
        else {
          *iVar5._M_current = iVar18;
          (this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        __args = (double *)
                 ((long)(aq->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar17);
        iVar6._M_current =
             (this->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&this->Uvalue,iVar6,__args);
          dVar20 = local_88;
        }
        else {
          *iVar6._M_current = *__args;
          (this->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar6._M_current + 1;
        }
      }
      lVar14 = lVar14 + 1;
      lVar19 = lVar19 + 4;
      lVar17 = lVar17 + 8;
    } while (lVar14 < aq->packCount);
  }
  iVar18 = (int)((ulong)((long)(this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  local_90 = (double)CONCAT44(local_90._4_4_,iVar18);
  iVar5._M_current =
       (this->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar5._M_current ==
      (this->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->Ulastp,iVar5,(int *)&local_90);
    piVar16 = (this->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    dVar20 = local_88;
  }
  else {
    *iVar5._M_current = iVar18;
    piVar16 = iVar5._M_current + 1;
    (this->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar16;
  }
  local_50 = (vector<int,std::allocator<int>> *)&this->URlastp;
  iVar18 = (this->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  lVar17 = (long)iVar18;
  iVar13 = piVar16[-1];
  iVar9 = (iVar13 - iVar18) + 1;
  this->UtotalX = this->UtotalX + iVar9;
  this->FtotalX = this->FtotalX + iVar9;
  if (iVar18 < iVar13) {
    local_58 = &this->URindex;
    local_60 = &this->URvalue;
    piVar10 = (this->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar13 = iVar13 - iVar18;
    do {
      iVar18 = (this->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [(this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar17]];
      iVar9 = piVar10[iVar18];
      if (iVar9 == 0) {
        iVar9 = (this->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar18];
        local_38 = (long)iVar9;
        local_6c = (this->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar18];
        local_78 = (vector<int,std::allocator<int>> *)(long)local_6c;
        local_6c = local_6c - iVar9;
        iVar9 = (int)((double)local_6c * 1.1 + 5.0);
        iVar7 = (int)((ulong)((long)(this->URindex).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->URindex).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2);
        __new_size = (size_type)(iVar7 + iVar9);
        std::vector<int,_std::allocator<int>_>::resize(local_58,__new_size);
        std::vector<double,_std::allocator<double>_>::resize(local_60,__new_size);
        lVar14 = local_38;
        lVar19 = (long)iVar7;
        sVar12 = (long)local_78 * 4 + local_38 * -4;
        if (sVar12 != 0) {
          piVar10 = (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          local_40 = lVar19;
          memmove(piVar10 + lVar19,piVar10 + local_38,sVar12);
          lVar19 = local_40;
        }
        sVar12 = (long)local_78 * 8 + lVar14 * -8;
        if (sVar12 != 0) {
          pdVar4 = (local_60->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          memmove(pdVar4 + lVar19,pdVar4 + lVar14,sVar12);
        }
        (this->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar18] = iVar7;
        piVar11 = (this->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar11[iVar18] = iVar7 + local_6c;
        iVar9 = iVar9 - local_6c;
        piVar10 = (this->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar10[iVar18] = iVar9;
        dVar20 = local_88;
      }
      else {
        piVar11 = *(pointer *)local_50;
      }
      piVar10[iVar18] = iVar9 + -1;
      iVar9 = piVar11[iVar18];
      piVar11[iVar18] = iVar9 + 1;
      (this->URindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar9] = local_94;
      (this->URvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar9] =
           (this->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar17];
      lVar17 = lVar17 + 1;
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
  }
  this_00 = &this->URstart;
  piVar10 = (this->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar5._M_current =
       (this->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  if (iVar5._M_current ==
      (this->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)this_00,iVar5,piVar10 + local_80);
    piVar10 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    dVar20 = local_88;
  }
  else {
    *iVar5._M_current = piVar10[local_80];
    (this->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar5._M_current + 1;
  }
  pHVar8 = local_68;
  lVar17 = local_80;
  iVar5._M_current =
       (this->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  if (iVar5._M_current ==
      (this->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              (local_50,iVar5,piVar10 + local_80);
    iVar18 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start[lVar17];
    dVar20 = local_88;
  }
  else {
    iVar18 = piVar10[local_80];
    *iVar5._M_current = iVar18;
    (this->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar5._M_current + 1;
  }
  iVar18 = ((this->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar17] +
           (this->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar17]) - iVar18;
  local_90 = (double)CONCAT44(local_90._4_4_,iVar18);
  iVar5._M_current =
       (this->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  if (iVar5._M_current ==
      (this->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->URspace,iVar5,(int *)&local_90);
    dVar20 = local_88;
  }
  else {
    *iVar5._M_current = iVar18;
    (this->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar5._M_current + 1;
  }
  iVar5._M_current =
       (this->UpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start[local_94] =
       (int)((ulong)((long)iVar5._M_current -
                    (long)(this->UpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2);
  if (iVar5._M_current ==
      (this->UpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->UpivotIndex,iVar5,&local_94);
    dVar20 = local_88;
  }
  else {
    *iVar5._M_current = local_94;
    (this->UpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_90 = dVar20 * local_48;
  iVar6._M_current =
       (this->UpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar6._M_current ==
      (this->UpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->UpivotValue,iVar6,&local_90);
  }
  else {
    *iVar6._M_current = local_90;
    (this->UpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar6._M_current + 1;
  }
  iVar18 = pHVar8->packCount;
  if (0 < iVar18) {
    lVar17 = 0;
    lVar14 = 0;
    do {
      piVar10 = (pHVar8->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar13 = *(int *)((long)piVar10 + lVar17);
      if (iVar13 != local_94) {
        iVar5._M_current =
             (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->PFindex,iVar5,
                     (int *)((long)piVar10 + lVar17));
        }
        else {
          *iVar5._M_current = iVar13;
          (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        local_90 = -*(double *)
                     ((long)(pHVar8->packValue).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar17 * 2) * local_48;
        iVar6._M_current =
             (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&this->PFvalue,iVar6,&local_90);
        }
        else {
          *iVar6._M_current = local_90;
          (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar6._M_current + 1;
        }
        iVar18 = pHVar8->packCount;
      }
      lVar14 = lVar14 + 1;
      lVar17 = lVar17 + 4;
    } while (lVar14 < iVar18);
  }
  piVar10 = (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  iVar18 = (int)((ulong)((long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                        (long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  this->UtotalX = (this->UtotalX - piVar10[-1]) + iVar18;
  this->FtotalX = (iVar18 - piVar10[-1]) + this->FtotalX + 1;
  iVar5._M_current =
       (this->PFpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->PFpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->PFpivotIndex,iVar5,&local_94);
    iVar18 = (int)((ulong)((long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2);
  }
  else {
    *iVar5._M_current = local_94;
    (this->PFpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_90 = (double)CONCAT44(local_90._4_4_,iVar18);
  iVar5._M_current =
       (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  if (iVar5._M_current ==
      (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->PFstart,iVar5,(int *)&local_90);
  }
  else {
    *iVar5._M_current = iVar18;
    (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar5._M_current + 1;
  }
  iVar18 = ((this->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_80] -
           (this->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[local_80]) + this->UtotalX;
  this->UtotalX = iVar18;
  this->UtotalX =
       (iVar18 - (this->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[local_80]) +
       (this->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start[local_80];
  return;
}

Assistant:

void HFactor::updateFT(HVector *aq, HVector *ep, int iRow, int *hint) {
    // Store pivot
    int pLogic = UpivotLookup[iRow];
    double pivot = UpivotValue[pLogic];
    double alpha = aq->array[iRow];
    UpivotIndex[pLogic] = -1;

    // Delete pivotal row from U
    FtotalX -= URlastp[pLogic] - URstart[pLogic];
    for (int k = URstart[pLogic]; k < URlastp[pLogic]; k++) {
        // Find the pivotal position
        int iLogic = UpivotLookup[URindex[k]];
        int iFind = Ustart[iLogic];
        int iLast = --Ulastp[iLogic];
        for (; iFind <= iLast; iFind++)
            if (Uindex[iFind] == iRow)
                break;
        // Put last to find, and delete last
        Uindex[iFind] = Uindex[iLast];
        Uvalue[iFind] = Uvalue[iLast];
    }

    // Delete pivotal column from UR
    FtotalX -= Ulastp[pLogic] - Ustart[pLogic];
    for (int k = Ustart[pLogic]; k < Ulastp[pLogic]; k++) {
        // Find the pivotal position
        int iLogic = UpivotLookup[Uindex[k]];
        int iFind = URstart[iLogic];
        int iLast = --URlastp[iLogic];
        for (; iFind <= iLast; iFind++)
            if (URindex[iFind] == iRow)
                break;
        // Put last to find, and delete last
        URspace[iLogic]++;
        URindex[iFind] = URindex[iLast];
        URvalue[iFind] = URvalue[iLast];
    }

    // Store column to U
    Ustart.push_back(Uindex.size());
    for (int i = 0; i < aq->packCount; i++)
        if (aq->packIndex[i] != iRow) {
            Uindex.push_back(aq->packIndex[i]);
            Uvalue.push_back(aq->packValue[i]);
        }
    Ulastp.push_back(Uindex.size());
    int UstartX = Ustart.back();
    int UendX = Ulastp.back();
    UtotalX += UendX - UstartX + 1;
    FtotalX += UendX - UstartX + 1;

    // Store column as UR elements
    for (int k = UstartX; k < UendX; k++) {
        // Which ETA file
        int iLogic = UpivotLookup[Uindex[k]];

        // Move row to the end if necessary
        if (URspace[iLogic] == 0) {
            // Make pointers
            int row_start = URstart[iLogic];
            int row_count = URlastp[iLogic] - row_start;
            int new_start = URindex.size();
            int new_space = row_count * 1.1 + 5;

            // Check matrix UR
            URindex.resize(new_start + new_space);
            URvalue.resize(new_start + new_space);

            // Move elements
            int iFrom = row_start;
            int iEnd = row_start + row_count;
            int iTo = new_start;
            copy(&URindex[iFrom], &URindex[iEnd], &URindex[iTo]);
            copy(&URvalue[iFrom], &URvalue[iEnd], &URvalue[iTo]);

            // Save new pointers
            URstart[iLogic] = new_start;
            URlastp[iLogic] = new_start + row_count;
            URspace[iLogic] = new_space - row_count;
        }

        // Put into the next available space
        URspace[iLogic]--;
        int iPut = URlastp[iLogic]++;
        URindex[iPut] = iRow;
        URvalue[iPut] = Uvalue[k];
    }

    // Store UR pointers
    URstart.push_back(URstart[pLogic]);
    URlastp.push_back(URstart[pLogic]);
    URspace.push_back(URspace[pLogic] + URlastp[pLogic] - URstart[pLogic]);

    // Update pivot count
    UpivotLookup[iRow] = UpivotIndex.size();
    UpivotIndex.push_back(iRow);
    UpivotValue.push_back(pivot * alpha);

    // Store row_ep as R matrix
    for (int i = 0; i < ep->packCount; i++) {
        if (ep->packIndex[i] != iRow) {
            PFindex.push_back(ep->packIndex[i]);
            PFvalue.push_back(-ep->packValue[i] * pivot);
        }
    }
    UtotalX += PFindex.size() - PFstart.back();
    FtotalX += PFindex.size() - PFstart.back() + 1;

    // Store R matrix pivot
    PFpivotIndex.push_back(iRow);
    PFstart.push_back(PFindex.size());

    // Update total countX
    UtotalX -= Ulastp[pLogic] - Ustart[pLogic];
    UtotalX -= URlastp[pLogic] - URstart[pLogic];

//    // See if we want refactor
//    if (UtotalX > UmeritX && PFpivotIndex.size() > 100)
//        *hint = 1;
}